

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O3

void EncodeContextMap(MemoryManager *m,EncodeContextMapArena *arena,uint32_t *context_map,
                     size_t context_map_size,size_t num_clusters,HuffmanTree *tree,
                     size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  void *p;
  size_t sVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  uint32_t uVar33;
  uint uVar34;
  uint uVar35;
  int *piVar36;
  char cVar37;
  bool bVar38;
  int iVar49;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar50;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar86;
  int iVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  char local_138 [264];
  long lVar52;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters == 1) {
    return;
  }
  p = duckdb_brotli::BrotliAllocate(m,context_map_size * 4);
  uVar33 = *context_map;
  if (1 < context_map_size) {
    sVar27 = 1;
    do {
      if (uVar33 < context_map[sVar27]) {
        uVar33 = context_map[sVar27];
      }
      sVar27 = sVar27 + 1;
    } while (context_map_size != sVar27);
  }
  auVar39._4_4_ = 0;
  auVar39._0_4_ = uVar33;
  auVar39._8_4_ = uVar33;
  auVar39._12_4_ = 0;
  uVar30 = 0;
  auVar40 = auVar39;
  auVar51 = _DAT_01dda0d0;
  auVar53 = _DAT_01dda0e0;
  auVar54 = _DAT_01dda0f0;
  auVar55 = _DAT_01dda100;
  auVar56 = _DAT_01db9e70;
  auVar57 = _DAT_01db9e80;
  auVar58 = _DAT_01db9e50;
  auVar59 = _DAT_01d8a380;
  do {
    auVar69 = auVar39 ^ _DAT_01d8a390;
    auVar73 = auVar59 ^ _DAT_01d8a390;
    iVar49 = auVar69._0_4_;
    iVar86 = -(uint)(iVar49 < auVar73._0_4_);
    iVar50 = auVar69._4_4_;
    auVar75._4_4_ = -(uint)(iVar50 < auVar73._4_4_);
    iVar71 = auVar69._8_4_;
    iVar90 = -(uint)(iVar71 < auVar73._8_4_);
    iVar72 = auVar69._12_4_;
    auVar75._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
    auVar69._4_4_ = iVar86;
    auVar69._0_4_ = iVar86;
    auVar69._8_4_ = iVar90;
    auVar69._12_4_ = iVar90;
    auVar69 = pshuflw(auVar40,auVar69,0xe8);
    auVar74._4_4_ = -(uint)(auVar73._4_4_ == iVar50);
    auVar74._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
    auVar74._0_4_ = auVar74._4_4_;
    auVar74._8_4_ = auVar74._12_4_;
    auVar60 = pshuflw(in_XMM11,auVar74,0xe8);
    auVar75._0_4_ = auVar75._4_4_;
    auVar75._8_4_ = auVar75._12_4_;
    auVar73 = pshuflw(auVar69,auVar75,0xe8);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar40 = (auVar73 | auVar60 & auVar69) ^ auVar40;
    auVar40 = packssdw(auVar40,auVar40);
    cVar37 = (char)uVar30;
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_138[uVar30] = cVar37;
    }
    auVar60._4_4_ = iVar86;
    auVar60._0_4_ = iVar86;
    auVar60._8_4_ = iVar90;
    auVar60._12_4_ = iVar90;
    auVar75 = auVar74 & auVar60 | auVar75;
    auVar40 = packssdw(auVar75,auVar75);
    auVar73._8_4_ = 0xffffffff;
    auVar73._0_8_ = 0xffffffffffffffff;
    auVar73._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar73,auVar40 ^ auVar73);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 8 & 1) != 0) {
      local_138[uVar30 + 1] = cVar37 + '\x01';
    }
    auVar40 = auVar58 ^ _DAT_01d8a390;
    auVar61._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar61._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar61._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar61._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar76._4_4_ = auVar61._0_4_;
    auVar76._0_4_ = auVar61._0_4_;
    auVar76._8_4_ = auVar61._8_4_;
    auVar76._12_4_ = auVar61._8_4_;
    iVar86 = -(uint)(auVar40._4_4_ == iVar50);
    iVar90 = -(uint)(auVar40._12_4_ == iVar72);
    auVar13._4_4_ = iVar86;
    auVar13._0_4_ = iVar86;
    auVar13._8_4_ = iVar90;
    auVar13._12_4_ = iVar90;
    auVar87._4_4_ = auVar61._4_4_;
    auVar87._0_4_ = auVar61._4_4_;
    auVar87._8_4_ = auVar61._12_4_;
    auVar87._12_4_ = auVar61._12_4_;
    auVar40 = auVar13 & auVar76 | auVar87;
    auVar40 = packssdw(auVar40,auVar40);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar4,auVar40 ^ auVar4);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
      local_138[uVar30 + 2] = cVar37 + '\x02';
    }
    auVar40 = pshufhw(auVar40,auVar76,0x84);
    auVar14._4_4_ = iVar86;
    auVar14._0_4_ = iVar86;
    auVar14._8_4_ = iVar90;
    auVar14._12_4_ = iVar90;
    auVar73 = pshufhw(auVar61,auVar14,0x84);
    auVar69 = pshufhw(auVar40,auVar87,0x84);
    auVar41._8_4_ = 0xffffffff;
    auVar41._0_8_ = 0xffffffffffffffff;
    auVar41._12_4_ = 0xffffffff;
    auVar41 = (auVar69 | auVar73 & auVar40) ^ auVar41;
    auVar40 = packssdw(auVar41,auVar41);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
      local_138[uVar30 + 3] = cVar37 + '\x03';
    }
    auVar40 = auVar57 ^ _DAT_01d8a390;
    auVar62._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar62._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar62._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar62._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar15._4_4_ = auVar62._0_4_;
    auVar15._0_4_ = auVar62._0_4_;
    auVar15._8_4_ = auVar62._8_4_;
    auVar15._12_4_ = auVar62._8_4_;
    auVar73 = pshuflw(auVar87,auVar15,0xe8);
    auVar42._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar50);
    auVar42._8_4_ = -(uint)(auVar40._8_4_ == iVar71);
    auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar72);
    auVar77._4_4_ = auVar42._4_4_;
    auVar77._0_4_ = auVar42._4_4_;
    auVar77._8_4_ = auVar42._12_4_;
    auVar77._12_4_ = auVar42._12_4_;
    auVar40 = pshuflw(auVar42,auVar77,0xe8);
    auVar78._4_4_ = auVar62._4_4_;
    auVar78._0_4_ = auVar62._4_4_;
    auVar78._8_4_ = auVar62._12_4_;
    auVar78._12_4_ = auVar62._12_4_;
    auVar69 = pshuflw(auVar62,auVar78,0xe8);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar73,(auVar69 | auVar40 & auVar73) ^ auVar5);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_138[uVar30 + 4] = cVar37 + '\x04';
    }
    auVar16._4_4_ = auVar62._0_4_;
    auVar16._0_4_ = auVar62._0_4_;
    auVar16._8_4_ = auVar62._8_4_;
    auVar16._12_4_ = auVar62._8_4_;
    auVar78 = auVar77 & auVar16 | auVar78;
    auVar69 = packssdw(auVar78,auVar78);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar69 ^ auVar6);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._4_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 5] = cVar37 + '\x05';
    }
    auVar40 = auVar56 ^ _DAT_01d8a390;
    auVar63._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar63._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar63._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar63._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar79._4_4_ = auVar63._0_4_;
    auVar79._0_4_ = auVar63._0_4_;
    auVar79._8_4_ = auVar63._8_4_;
    auVar79._12_4_ = auVar63._8_4_;
    iVar86 = -(uint)(auVar40._4_4_ == iVar50);
    iVar90 = -(uint)(auVar40._12_4_ == iVar72);
    auVar17._4_4_ = iVar86;
    auVar17._0_4_ = iVar86;
    auVar17._8_4_ = iVar90;
    auVar17._12_4_ = iVar90;
    auVar88._4_4_ = auVar63._4_4_;
    auVar88._0_4_ = auVar63._4_4_;
    auVar88._8_4_ = auVar63._12_4_;
    auVar88._12_4_ = auVar63._12_4_;
    auVar40 = auVar17 & auVar79 | auVar88;
    auVar40 = packssdw(auVar40,auVar40);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar7,auVar40 ^ auVar7);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_138[uVar30 + 6] = cVar37 + '\x06';
    }
    auVar40 = pshufhw(auVar40,auVar79,0x84);
    auVar18._4_4_ = iVar86;
    auVar18._0_4_ = iVar86;
    auVar18._8_4_ = iVar90;
    auVar18._12_4_ = iVar90;
    auVar73 = pshufhw(auVar63,auVar18,0x84);
    auVar69 = pshufhw(auVar40,auVar88,0x84);
    auVar43._8_4_ = 0xffffffff;
    auVar43._0_8_ = 0xffffffffffffffff;
    auVar43._12_4_ = 0xffffffff;
    auVar43 = (auVar69 | auVar73 & auVar40) ^ auVar43;
    auVar40 = packssdw(auVar43,auVar43);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._6_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 7] = cVar37 + '\a';
    }
    auVar40 = auVar55 ^ _DAT_01d8a390;
    auVar64._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar64._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar64._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar64._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar19._4_4_ = auVar64._0_4_;
    auVar19._0_4_ = auVar64._0_4_;
    auVar19._8_4_ = auVar64._8_4_;
    auVar19._12_4_ = auVar64._8_4_;
    auVar73 = pshuflw(auVar88,auVar19,0xe8);
    auVar44._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar50);
    auVar44._8_4_ = -(uint)(auVar40._8_4_ == iVar71);
    auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar72);
    auVar80._4_4_ = auVar44._4_4_;
    auVar80._0_4_ = auVar44._4_4_;
    auVar80._8_4_ = auVar44._12_4_;
    auVar80._12_4_ = auVar44._12_4_;
    auVar40 = pshuflw(auVar44,auVar80,0xe8);
    auVar81._4_4_ = auVar64._4_4_;
    auVar81._0_4_ = auVar64._4_4_;
    auVar81._8_4_ = auVar64._12_4_;
    auVar81._12_4_ = auVar64._12_4_;
    auVar69 = pshuflw(auVar64,auVar81,0xe8);
    auVar65._8_4_ = 0xffffffff;
    auVar65._0_8_ = 0xffffffffffffffff;
    auVar65._12_4_ = 0xffffffff;
    auVar65 = (auVar69 | auVar40 & auVar73) ^ auVar65;
    auVar69 = packssdw(auVar65,auVar65);
    auVar40 = packsswb(auVar40 & auVar73,auVar69);
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_138[uVar30 + 8] = cVar37 + '\b';
    }
    auVar20._4_4_ = auVar64._0_4_;
    auVar20._0_4_ = auVar64._0_4_;
    auVar20._8_4_ = auVar64._8_4_;
    auVar20._12_4_ = auVar64._8_4_;
    auVar81 = auVar80 & auVar20 | auVar81;
    auVar69 = packssdw(auVar81,auVar81);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar69 = packssdw(auVar69 ^ auVar8,auVar69 ^ auVar8);
    auVar40 = packsswb(auVar40,auVar69);
    if ((auVar40._8_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 9] = cVar37 + '\t';
    }
    auVar40 = auVar54 ^ _DAT_01d8a390;
    auVar66._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar66._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar66._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar66._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar82._4_4_ = auVar66._0_4_;
    auVar82._0_4_ = auVar66._0_4_;
    auVar82._8_4_ = auVar66._8_4_;
    auVar82._12_4_ = auVar66._8_4_;
    iVar86 = -(uint)(auVar40._4_4_ == iVar50);
    iVar90 = -(uint)(auVar40._12_4_ == iVar72);
    auVar21._4_4_ = iVar86;
    auVar21._0_4_ = iVar86;
    auVar21._8_4_ = iVar90;
    auVar21._12_4_ = iVar90;
    auVar89._4_4_ = auVar66._4_4_;
    auVar89._0_4_ = auVar66._4_4_;
    auVar89._8_4_ = auVar66._12_4_;
    auVar89._12_4_ = auVar66._12_4_;
    auVar40 = auVar21 & auVar82 | auVar89;
    auVar40 = packssdw(auVar40,auVar40);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_138[uVar30 + 10] = cVar37 + '\n';
    }
    auVar40 = pshufhw(auVar40,auVar82,0x84);
    auVar22._4_4_ = iVar86;
    auVar22._0_4_ = iVar86;
    auVar22._8_4_ = iVar90;
    auVar22._12_4_ = iVar90;
    auVar73 = pshufhw(auVar66,auVar22,0x84);
    auVar69 = pshufhw(auVar40,auVar89,0x84);
    auVar45._8_4_ = 0xffffffff;
    auVar45._0_8_ = 0xffffffffffffffff;
    auVar45._12_4_ = 0xffffffff;
    auVar45 = (auVar69 | auVar73 & auVar40) ^ auVar45;
    auVar40 = packssdw(auVar45,auVar45);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._10_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 0xb] = cVar37 + '\v';
    }
    auVar40 = auVar53 ^ _DAT_01d8a390;
    auVar67._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar67._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar67._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar67._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar23._4_4_ = auVar67._0_4_;
    auVar23._0_4_ = auVar67._0_4_;
    auVar23._8_4_ = auVar67._8_4_;
    auVar23._12_4_ = auVar67._8_4_;
    auVar73 = pshuflw(auVar89,auVar23,0xe8);
    auVar46._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar46._4_4_ = -(uint)(auVar40._4_4_ == iVar50);
    auVar46._8_4_ = -(uint)(auVar40._8_4_ == iVar71);
    auVar46._12_4_ = -(uint)(auVar40._12_4_ == iVar72);
    auVar83._4_4_ = auVar46._4_4_;
    auVar83._0_4_ = auVar46._4_4_;
    auVar83._8_4_ = auVar46._12_4_;
    auVar83._12_4_ = auVar46._12_4_;
    auVar40 = pshuflw(auVar46,auVar83,0xe8);
    auVar84._4_4_ = auVar67._4_4_;
    auVar84._0_4_ = auVar67._4_4_;
    auVar84._8_4_ = auVar67._12_4_;
    auVar84._12_4_ = auVar67._12_4_;
    auVar69 = pshuflw(auVar67,auVar84,0xe8);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar73,(auVar69 | auVar40 & auVar73) ^ auVar10);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_138[uVar30 + 0xc] = cVar37 + '\f';
    }
    auVar24._4_4_ = auVar67._0_4_;
    auVar24._0_4_ = auVar67._0_4_;
    auVar24._8_4_ = auVar67._8_4_;
    auVar24._12_4_ = auVar67._8_4_;
    auVar84 = auVar83 & auVar24 | auVar84;
    auVar69 = packssdw(auVar84,auVar84);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar69 ^ auVar11);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._12_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 0xd] = cVar37 + '\r';
    }
    auVar40 = auVar51 ^ _DAT_01d8a390;
    auVar68._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar68._4_4_ = -(uint)(iVar50 < auVar40._4_4_);
    auVar68._8_4_ = -(uint)(iVar71 < auVar40._8_4_);
    auVar68._12_4_ = -(uint)(iVar72 < auVar40._12_4_);
    auVar85._4_4_ = auVar68._0_4_;
    auVar85._0_4_ = auVar68._0_4_;
    auVar85._8_4_ = auVar68._8_4_;
    auVar85._12_4_ = auVar68._8_4_;
    iVar49 = -(uint)(auVar40._4_4_ == iVar50);
    iVar50 = -(uint)(auVar40._12_4_ == iVar72);
    auVar70._4_4_ = iVar49;
    auVar70._0_4_ = iVar49;
    auVar70._8_4_ = iVar50;
    auVar70._12_4_ = iVar50;
    auVar47._4_4_ = auVar68._4_4_;
    auVar47._0_4_ = auVar68._4_4_;
    auVar47._8_4_ = auVar68._12_4_;
    auVar47._12_4_ = auVar68._12_4_;
    auVar47 = auVar70 & auVar85 | auVar47;
    auVar40 = packssdw(auVar47,auVar47);
    auVar12._8_4_ = 0xffffffff;
    auVar12._0_8_ = 0xffffffffffffffff;
    auVar12._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar12,auVar40 ^ auVar12);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_138[uVar30 + 0xe] = cVar37 + '\x0e';
    }
    auVar40 = pshufhw(auVar40,auVar85,0x84);
    in_XMM11 = pshufhw(auVar68,auVar70,0x84);
    in_XMM11 = in_XMM11 & auVar40;
    auVar25._4_4_ = auVar68._4_4_;
    auVar25._0_4_ = auVar68._4_4_;
    auVar25._8_4_ = auVar68._12_4_;
    auVar25._12_4_ = auVar68._12_4_;
    auVar40 = pshufhw(auVar40,auVar25,0x84);
    auVar48._8_4_ = 0xffffffff;
    auVar48._0_8_ = 0xffffffffffffffff;
    auVar48._12_4_ = 0xffffffff;
    auVar48 = (auVar40 | in_XMM11) ^ auVar48;
    auVar40 = packssdw(auVar48,auVar48);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._14_2_ >> 8 & 1) != 0) {
      local_138[uVar30 + 0xf] = cVar37 + '\x0f';
    }
    uVar30 = uVar30 + 0x10;
    lVar32 = (long)DAT_01dda110;
    lVar52 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + lVar32;
    lVar28 = DAT_01dda110._8_8_;
    auVar59._8_8_ = lVar52 + lVar28;
    lVar52 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + lVar32;
    auVar58._8_8_ = lVar52 + lVar28;
    lVar52 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + lVar32;
    auVar57._8_8_ = lVar52 + lVar28;
    lVar52 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + lVar32;
    auVar56._8_8_ = lVar52 + lVar28;
    lVar52 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + lVar32;
    auVar55._8_8_ = lVar52 + lVar28;
    lVar52 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + lVar32;
    auVar54._8_8_ = lVar52 + lVar28;
    lVar52 = auVar53._8_8_;
    auVar53._0_8_ = auVar53._0_8_ + lVar32;
    auVar53._8_8_ = lVar52 + lVar28;
    lVar52 = auVar51._8_8_;
    auVar51._0_8_ = auVar51._0_8_ + lVar32;
    auVar51._8_8_ = lVar52 + lVar28;
    auVar40 = _DAT_01dda110;
  } while (((ulong)uVar33 + 0x10 & 0xfffffffffffffff0) != uVar30);
  if (context_map_size != 0) {
    uVar34 = uVar33 + 1;
    uVar30 = (ulong)uVar34;
    sVar27 = 0;
    do {
      if (uVar34 == 0) {
        *(undefined4 *)((long)p + sVar27 * 4) = 0;
        cVar37 = local_138[0];
      }
      else {
        cVar37 = (char)context_map[sVar27];
        uVar31 = 0;
        do {
          if (local_138[uVar31] == cVar37) {
            *(int *)((long)p + sVar27 * 4) = (int)uVar31;
            if (uVar31 == 0) goto LAB_01c029e6;
            goto LAB_01c029cd;
          }
          uVar31 = uVar31 + 1;
        } while (uVar30 != uVar31);
        *(uint *)((long)p + sVar27 * 4) = uVar34;
        cVar37 = local_138[uVar30];
        uVar31 = uVar30;
LAB_01c029cd:
        memmove(local_138 + 1,local_138,uVar31);
      }
LAB_01c029e6:
      local_138[0] = cVar37;
      sVar27 = sVar27 + 1;
    } while (sVar27 != context_map_size);
    uVar34 = 0;
    uVar30 = 0;
    do {
      uVar31 = uVar30 + 1;
      if (uVar30 + 1 < context_map_size) {
        uVar31 = context_map_size;
      }
      piVar36 = (int *)((long)p + uVar30 * 4);
      while (*(int *)((long)p + uVar30 * 4) != 0) {
        uVar30 = uVar30 + 1;
        piVar36 = piVar36 + 1;
        if (uVar31 == uVar30) {
          uVar29 = 0;
          goto LAB_01c02a6c;
        }
      }
      uVar29 = 0;
      if (uVar30 < context_map_size) {
        lVar32 = 0;
        while (*piVar36 == 0) {
          lVar32 = lVar32 + -1;
          piVar36 = piVar36 + 1;
          if (uVar30 - context_map_size == lVar32) {
            uVar29 = (int)context_map_size - (int)uVar30;
LAB_01c02a6c:
            if (uVar34 < uVar29) {
              uVar34 = uVar29;
            }
            goto LAB_01c02a71;
          }
        }
        uVar30 = uVar30 - lVar32;
        uVar29 = -(int)lVar32;
      }
      if (uVar34 < uVar29) {
        uVar34 = uVar29;
      }
    } while (uVar30 < context_map_size);
LAB_01c02a71:
    if (uVar34 != 0) {
      uVar29 = 0x1f;
      if (uVar34 != 0) {
        for (; uVar34 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      goto LAB_01c02a7e;
    }
  }
  uVar29 = 0;
LAB_01c02a7e:
  uVar30 = 6;
  if (uVar29 < 6) {
    uVar30 = (ulong)uVar29;
  }
  uVar34 = (uint)uVar30;
  if (context_map_size == 0) {
    lVar32 = 0;
    switchD_010444a0::default(arena,0,0x440);
    bVar38 = true;
  }
  else {
    uVar26 = 2 << ((byte)uVar30 & 0x1f);
    lVar32 = 0;
    uVar31 = 0;
    do {
      iVar49 = *(int *)((long)p + uVar31 * 4);
      if (iVar49 == 0) {
        uVar35 = 1;
        uVar2 = uVar31 + 1;
        if (context_map_size <= uVar31 + 1) {
LAB_01c02b10:
          uVar31 = uVar2;
          if (uVar26 <= uVar35) goto code_r0x01c02b14;
          uVar3 = 0x1f;
          if (uVar35 != 0) {
            for (; uVar35 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          *(uint *)((long)p + lVar32 * 4) = ((-1 << ((byte)uVar3 & 0x1f)) + uVar35) * 0x200 | uVar3;
          goto LAB_01c02ac0;
        }
        uVar35 = (int)context_map_size - (int)uVar31;
        lVar28 = 1;
        do {
          if (*(int *)((long)p + lVar28 * 4 + uVar31 * 4) != 0) {
            uVar35 = (uint)lVar28;
            break;
          }
          lVar28 = lVar28 + 1;
        } while (context_map_size - uVar31 != lVar28);
        uVar31 = uVar31 + uVar35;
        uVar2 = uVar31;
        if (uVar35 != 0) goto LAB_01c02b10;
      }
      else {
        *(uint *)((long)p + lVar32 * 4) = iVar49 + uVar34;
        uVar31 = uVar31 + 1;
LAB_01c02ac0:
        lVar32 = lVar32 + 1;
      }
LAB_01c02ac3:
    } while (uVar31 < context_map_size);
    switchD_010444a0::default(arena,0,0x440);
    bVar38 = lVar32 == 0;
    if (bVar38) {
      bVar38 = true;
      lVar32 = 0;
    }
    else {
      lVar28 = 0;
      do {
        arena->histogram[*(uint *)((long)p + lVar28 * 4) & 0x1ff] =
             arena->histogram[*(uint *)((long)p + lVar28 * 4) & 0x1ff] + 1;
        lVar28 = lVar28 + 1;
      } while (lVar32 != lVar28);
    }
  }
  uVar2 = *storage_ix;
  uVar31 = uVar2 + 1;
  *(ulong *)(storage + (uVar2 >> 3)) =
       (ulong)(uVar29 != 0) << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  *storage_ix = uVar31;
  if (uVar29 != 0) {
    *(ulong *)(storage + (uVar31 >> 3)) =
         (ulong)(uVar34 - 1) << ((byte)uVar31 & 7) | (ulong)storage[uVar31 >> 3];
    *storage_ix = uVar2 + 5;
  }
  BuildAndStoreHuffmanTree
            (arena->histogram,uVar30 + num_clusters,uVar30 + num_clusters,tree,arena->depths,
             arena->bits,storage_ix,storage);
  uVar30 = *storage_ix;
  if (!bVar38) {
    lVar28 = 0;
    do {
      uVar29 = *(uint *)((long)p + lVar28 * 4);
      uVar26 = uVar29 & 0x1ff;
      uVar31 = (ulong)uVar26;
      bVar1 = arena->depths[uVar31];
      *(ulong *)(storage + (uVar30 >> 3)) =
           (ulong)arena->bits[uVar31] << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
      uVar30 = bVar1 + uVar30;
      *storage_ix = uVar30;
      if (uVar26 - 1 < uVar34) {
        *(ulong *)(storage + (uVar30 >> 3)) =
             (ulong)(uVar29 >> 9) << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
        uVar30 = uVar30 + uVar31;
        *storage_ix = uVar30;
      }
      lVar28 = lVar28 + 1;
    } while (lVar32 != lVar28);
  }
  *(ulong *)(storage + (uVar30 >> 3)) = (ulong)storage[uVar30 >> 3] | 1L << ((byte)uVar30 & 7);
  *storage_ix = uVar30 + 1;
  duckdb_brotli::BrotliFree(m,p);
  return;
code_r0x01c02b14:
  *(uint *)((long)p + lVar32 * 4) = ~(-1 << ((byte)uVar30 & 0x1f)) << 9 | uVar34;
  lVar32 = lVar32 + 1;
  uVar35 = (uVar35 - uVar26) + 1;
  uVar2 = uVar31;
  if (uVar35 == 0) goto LAB_01c02ac3;
  goto LAB_01c02b10;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             EncodeContextMapArena* arena,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t* BROTLI_RESTRICT const depths = arena->depths;
  uint16_t* BROTLI_RESTRICT const bits = arena->bits;

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(arena->histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}